

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void free_cdef_linebuf_conditional(AV1_COMMON *cm,size_t *new_linebuf_size)

{
  long in_RSI;
  long in_RDI;
  int plane;
  CdefInfo *cdef_info;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    if (*(long *)(in_RSI + (long)iVar1 * 8) != *(long *)(in_RDI + 0x5c10 + (long)iVar1 * 8)) {
      aom_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      *(undefined8 *)(in_RDI + 0x5bd8 + (long)iVar1 * 8) = 0;
    }
  }
  return;
}

Assistant:

static inline void free_cdef_linebuf_conditional(
    AV1_COMMON *const cm, const size_t *new_linebuf_size) {
  CdefInfo *cdef_info = &cm->cdef_info;
  for (int plane = 0; plane < MAX_MB_PLANE; plane++) {
    if (new_linebuf_size[plane] != cdef_info->allocated_linebuf_size[plane]) {
      aom_free(cdef_info->linebuf[plane]);
      cdef_info->linebuf[plane] = NULL;
    }
  }
}